

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

UniValue * JSONRPCError(int code,string *message)

{
  UniValue *in_RDX;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *error;
  UniValue *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe98;
  UniValue *this;
  UniValue *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 uVar1;
  UniValue *this_00;
  allocator<char> local_11e;
  allocator<char> local_11d [277];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  this = in_RDI;
  this_00 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::UniValue(this,(VType)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)in_RDX,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffec8));
  UniValue::UniValue<int_&,_int,_true>
            ((UniValue *)CONCAT17(uVar1,in_stack_fffffffffffffec8),(int *)in_stack_fffffffffffffec0)
  ;
  UniValue::pushKV(in_RDX,(string *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0);
  UniValue::~UniValue(in_stack_fffffffffffffe88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(local_11d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)in_RDX,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffec8));
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec0);
  UniValue::pushKV(in_RDX,(string *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0);
  UniValue::~UniValue(in_stack_fffffffffffffe88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_11e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue JSONRPCError(int code, const std::string& message)
{
    UniValue error(UniValue::VOBJ);
    error.pushKV("code", code);
    error.pushKV("message", message);
    return error;
}